

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O0

void __thiscall kj::_::Mutex::assertLockedByCaller(Mutex *this,Exclusivity exclusivity)

{
  bool bVar1;
  Fault local_48;
  Fault f_1;
  DebugExpression<unsigned_int> local_38 [2];
  DebugExpression<unsigned_int> _kjCondition_1;
  Fault local_28;
  Fault f;
  DebugExpression<unsigned_int> local_18;
  Exclusivity local_14;
  DebugExpression<unsigned_int> _kjCondition;
  Exclusivity exclusivity_local;
  Mutex *this_local;
  
  local_14 = exclusivity;
  __kjCondition = this;
  if (exclusivity == EXCLUSIVE) {
    f.exception = (Exception *)
                  DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&_::MAGIC_ASSERT,&this->futex);
    local_18 = DebugExpression<unsigned_int_const&>::operator&
                         ((DebugExpression<unsigned_int_const&> *)&f,&EXCLUSIVE_HELD);
    bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_18);
    if (!bVar1) {
      Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<unsigned_int>&,char_const(&)[56]>
                (&local_28,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++"
                 ,0x186,FAILED,"futex & EXCLUSIVE_HELD",
                 "_kjCondition,\"Tried to call getAlreadyLocked*() but lock is not held.\"",
                 &local_18,(char (*) [56])"Tried to call getAlreadyLocked*() but lock is not held.")
      ;
      Debug::Fault::fatal(&local_28);
    }
  }
  else if (exclusivity == SHARED) {
    f_1.exception =
         (Exception *)
         DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,&this->futex);
    local_38[0] = DebugExpression<unsigned_int_const&>::operator&
                            ((DebugExpression<unsigned_int_const&> *)&f_1,&SHARED_COUNT_MASK);
    bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)local_38);
    if (!bVar1) {
      Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<unsigned_int>&,char_const(&)[56]>
                (&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++"
                 ,0x18a,FAILED,"futex & SHARED_COUNT_MASK",
                 "_kjCondition,\"Tried to call getAlreadyLocked*() but lock is not held.\"",local_38
                 ,(char (*) [56])"Tried to call getAlreadyLocked*() but lock is not held.");
      Debug::Fault::fatal(&local_48);
    }
  }
  return;
}

Assistant:

void Mutex::assertLockedByCaller(Exclusivity exclusivity) const {
  switch (exclusivity) {
    case EXCLUSIVE:
      KJ_ASSERT(futex & EXCLUSIVE_HELD,
                "Tried to call getAlreadyLocked*() but lock is not held.");
      break;
    case SHARED:
      KJ_ASSERT(futex & SHARED_COUNT_MASK,
                "Tried to call getAlreadyLocked*() but lock is not held.");
      break;
  }
}